

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ParseContext::ParseMessage<google::protobuf::MessageLite>
          (ParseContext *this,MessageLite *msg,char *ptr)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  char *ptr_00;
  pair<const_char_*,_int> pVar5;
  
  bVar1 = *ptr;
  uVar4 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar5 = ReadSizeFallback(ptr,(uint)bVar1);
    uVar4 = pVar5.second;
    ptr_00 = pVar5.first;
  }
  else {
    ptr_00 = ptr + 1;
  }
  if (ptr_00 != (char *)0x0) {
    iVar2 = EpsCopyInputStream::PushLimit(&this->super_EpsCopyInputStream,ptr_00,uVar4);
    iVar3 = this->depth_;
    this->depth_ = iVar3 + -1;
    if (0 < iVar3) {
      iVar3 = (*msg->_vptr_MessageLite[0xb])(msg,ptr_00,this);
      if (((char *)CONCAT44(extraout_var,iVar3) != (char *)0x0) &&
         (this->depth_ = this->depth_ + 1, (this->super_EpsCopyInputStream).last_tag_minus_1_ == 0))
      {
        uVar4 = iVar2 + (this->super_EpsCopyInputStream).limit_;
        (this->super_EpsCopyInputStream).limit_ = uVar4;
        (this->super_EpsCopyInputStream).limit_end_ =
             (this->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar4 >> 0x1f & uVar4);
        return (char *)CONCAT44(extraout_var,iVar3);
      }
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* ParseContext::ParseMessage(
    T* msg, const char* ptr) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  auto old = PushLimit(ptr, size);
  if (--depth_ < 0) return nullptr;
  ptr = msg->_InternalParse(ptr, this);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  depth_++;
  if (!PopLimit(old)) return nullptr;
  return ptr;
}